

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::lucky_phases(Internal *this)

{
  Internal *pIVar1;
  bool bVar2;
  Profile *pPVar3;
  Profile *pPVar4;
  Internal *in_RDI;
  double s;
  double s_00;
  double s_01;
  double s_02;
  Internal *in_stack_00000008;
  int res;
  int in_stack_000004a8;
  char in_stack_000004af;
  Internal *in_stack_000004b0;
  Internal *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  Internal *pIVar5;
  Internal *in_stack_ffffffffffffffb8;
  int local_14;
  int local_4;
  
  pPVar3 = (Profile *)0x100;
  require_mode(in_RDI,SEARCH);
  if ((in_RDI->opts).lucky == 0) {
    local_4 = 0;
  }
  else {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffb0);
    if (((bVar2) &&
        (bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffb0), bVar2))
       && ((in_RDI->external_prop & 1U) == 0)) {
      pPVar4 = pPVar3;
      if ((in_RDI->internal->profiles).search.level <= (in_RDI->internal->opts).profile) {
        pIVar5 = in_RDI->internal;
        pPVar4 = &(in_RDI->internal->profiles).search;
        time(in_RDI->internal,(time_t *)pPVar3);
        start_profiling(pIVar5,pPVar4,s);
      }
      if ((in_RDI->internal->profiles).lucky.level <= (in_RDI->internal->opts).profile) {
        pIVar5 = in_RDI->internal;
        pIVar1 = in_RDI->internal;
        time(in_RDI->internal,(time_t *)pPVar4);
        start_profiling(pIVar5,&(pIVar1->profiles).lucky,s_00);
      }
      in_RDI->searching_lucky_phases = true;
      (in_RDI->stats).lucky.tried = (in_RDI->stats).lucky.tried + 1;
      local_14 = trivially_false_satisfiable(in_stack_00000008);
      if (local_14 == 0) {
        local_14 = trivially_true_satisfiable(in_stack_00000008);
      }
      if (local_14 == 0) {
        local_14 = forward_true_satisfiable(in_stack_ffffffffffffffb8);
      }
      if (local_14 == 0) {
        local_14 = forward_false_satisfiable(in_stack_ffffffffffffffb8);
      }
      if (local_14 == 0) {
        local_14 = backward_false_satisfiable(in_stack_ffffffffffffffa8);
      }
      if (local_14 == 0) {
        local_14 = backward_true_satisfiable(in_stack_ffffffffffffffa8);
      }
      if (local_14 == 0) {
        local_14 = positive_horn_satisfiable(in_stack_00000008);
      }
      if (local_14 == 0) {
        local_14 = negative_horn_satisfiable(in_stack_00000008);
      }
      if (local_14 < 0) {
        local_14 = 0;
      }
      if (local_14 == 10) {
        (in_RDI->stats).lucky.succeeded = (in_RDI->stats).lucky.succeeded + 1;
      }
      pPVar3 = (Profile *)0x6c;
      report(in_stack_000004b0,in_stack_000004af,in_stack_000004a8);
      in_RDI->searching_lucky_phases = false;
      if ((in_RDI->internal->profiles).lucky.level <= (in_RDI->internal->opts).profile) {
        pIVar5 = in_RDI->internal;
        pPVar4 = &(in_RDI->internal->profiles).lucky;
        time(in_RDI->internal,(time_t *)pPVar3);
        pPVar3 = pPVar4;
        stop_profiling(pIVar5,pPVar3,s_01);
      }
      if ((in_RDI->internal->profiles).search.level <= (in_RDI->internal->opts).profile) {
        pIVar5 = in_RDI->internal;
        pPVar4 = &(in_RDI->internal->profiles).search;
        time(in_RDI->internal,(time_t *)pPVar3);
        stop_profiling(pIVar5,pPVar4,s_02);
      }
      local_4 = local_14;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Internal::lucky_phases () {
  assert (!level);
  require_mode (SEARCH);
  if (!opts.lucky)
    return 0;

  // TODO: Some of the lucky assignments can also be found if there are
  // assumptions, but this is not completely implemented nor tested yet.
  // Nothing done for constraint either.
  // External propagator assumes a CDCL loop, so lucky is not tried here.
  if (!assumptions.empty () || !constraint.empty () || external_prop)
    return 0;

  START (search);
  START (lucky);
  assert (!searching_lucky_phases);
  searching_lucky_phases = true;
  stats.lucky.tried++;
  int res = trivially_false_satisfiable ();
  if (!res)
    res = trivially_true_satisfiable ();
  if (!res)
    res = forward_true_satisfiable ();
  if (!res)
    res = forward_false_satisfiable ();
  if (!res)
    res = backward_false_satisfiable ();
  if (!res)
    res = backward_true_satisfiable ();
  if (!res)
    res = positive_horn_satisfiable ();
  if (!res)
    res = negative_horn_satisfiable ();
  if (res < 0)
    assert (termination_forced), res = 0;
  if (res == 10)
    stats.lucky.succeeded++;
  report ('l', !res);
  assert (searching_lucky_phases);
  searching_lucky_phases = false;
  STOP (lucky);
  STOP (search);

  return res;
}